

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaintype.cpp
# Opt level: O2

string * ChainTypeToString_abi_cxx11_(string *__return_storage_ptr__,ChainType chain)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(chain) {
  case MAIN:
    __s = "main";
    __a = &local_11;
    break;
  case TESTNET:
    __s = "test";
    __a = &local_12;
    break;
  case SIGNET:
    __s = "signet";
    __a = &local_14;
    break;
  case REGTEST:
    __s = "regtest";
    __a = &local_15;
    break;
  case TESTNET4:
    __s = "testnet4";
    __a = &local_13;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/chaintype.cpp"
                  ,0x19,"std::string ChainTypeToString(ChainType)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ChainTypeToString(ChainType chain)
{
    switch (chain) {
    case ChainType::MAIN:
        return "main";
    case ChainType::TESTNET:
        return "test";
    case ChainType::TESTNET4:
        return "testnet4";
    case ChainType::SIGNET:
        return "signet";
    case ChainType::REGTEST:
        return "regtest";
    }
    assert(false);
}